

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecursiveDescentParser.cpp
# Opt level: O0

shared_ptr<MyCompiler::Statement> __thiscall
MyCompiler::RecursiveDescentParser::parse<MyCompiler::Statement>(RecursiveDescentParser *this)

{
  uint uVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *__x;
  socklen_t *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  sockaddr *__addr_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  sockaddr *__addr_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  sockaddr *__addr_02;
  sockaddr *__addr_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  sockaddr *__addr_04;
  sockaddr *__addr_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  sockaddr *__addr_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  RecursiveDescentParser *in_RSI;
  shared_ptr<MyCompiler::Statement> sVar5;
  allocator local_209;
  string local_208 [32];
  undefined1 local_1e8 [24];
  string local_1d0 [32];
  undefined1 local_1b0 [24];
  string local_198 [39];
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [24];
  string local_138 [32];
  undefined1 local_118 [16];
  undefined1 local_108 [24];
  string local_f0 [32];
  undefined1 local_d0 [16];
  undefined1 local_c0 [24];
  string local_a8 [32];
  undefined1 local_88 [16];
  undefined1 local_78 [24];
  string local_60 [48];
  undefined1 local_30 [32];
  RecursiveDescentParser *this_local;
  shared_ptr<MyCompiler::Statement> *pResult;
  
  local_30[0x17] = 0;
  this_local = this;
  sVar5 = std::make_shared<MyCompiler::Statement>();
  if (in_RSI->sym == IDENT) {
    peVar2 = std::
             __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    (peVar2->super_AbstractAstNode).caseNum = 0;
    parse<MyCompiler::Ident>((RecursiveDescentParser *)local_30);
    peVar2 = std::
             __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::shared_ptr<MyCompiler::Ident>::operator=
              (&peVar2->pIdent,(shared_ptr<MyCompiler::Ident> *)local_30);
    std::shared_ptr<MyCompiler::Ident>::~shared_ptr((shared_ptr<MyCompiler::Ident> *)local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_60,"assignment operator expected",(allocator *)(local_78 + 0x17));
    except(in_RSI,BECOMES,(string *)local_60);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)(local_78 + 0x17));
    parse<MyCompiler::Expression>((RecursiveDescentParser *)local_78);
    peVar2 = std::
             __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::shared_ptr<MyCompiler::Expression>::operator=
              (&peVar2->pExpression,(shared_ptr<MyCompiler::Expression> *)local_78);
    std::shared_ptr<MyCompiler::Expression>::~shared_ptr
              ((shared_ptr<MyCompiler::Expression> *)local_78);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    uVar1 = accept(in_RSI,0x15,
                   (sockaddr *)
                   sVar5.super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._M_pi,in_RCX);
    if ((uVar1 & 1) == 0) {
      uVar1 = accept(in_RSI,0x17,__addr,in_RCX);
      if ((uVar1 & 1) == 0) {
        uVar1 = accept(in_RSI,0x1b,__addr_00,in_RCX);
        if ((uVar1 & 1) == 0) {
          uVar1 = accept(in_RSI,0x19,__addr_01,in_RCX);
          if ((uVar1 & 1) == 0) {
            uVar1 = accept(in_RSI,0x18,__addr_02,in_RCX);
            if ((uVar1 & 1) == 0) {
              uVar1 = accept(in_RSI,0x13,__addr_04,in_RCX);
              if ((uVar1 & 1) == 0) {
                peVar2 = std::
                         __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)this);
                (peVar2->super_AbstractAstNode).caseNum = 7;
                _Var4._M_pi = extraout_RDX_06;
              }
              else {
                peVar2 = std::
                         __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)this);
                (peVar2->super_AbstractAstNode).caseNum = 6;
                do {
                  peVar2 = std::
                           __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)this);
                  parse<MyCompiler::Statement>((RecursiveDescentParser *)local_1e8);
                  __x = std::
                        __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator*((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_1e8);
                  std::vector<MyCompiler::Statement,_std::allocator<MyCompiler::Statement>_>::
                  push_back(&peVar2->vStatement,__x);
                  std::shared_ptr<MyCompiler::Statement>::~shared_ptr
                            ((shared_ptr<MyCompiler::Statement> *)local_1e8);
                  uVar1 = accept(in_RSI,0x10,__addr_06,in_RCX);
                } while ((uVar1 & 1) != 0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_208,"semicolon or end expected",&local_209);
                except(in_RSI,END,(string *)local_208);
                std::__cxx11::string::~string(local_208);
                std::allocator<char>::~allocator((allocator<char> *)&local_209);
                _Var4._M_pi = extraout_RDX_05;
              }
            }
            else {
              peVar2 = std::
                       __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)this);
              (peVar2->super_AbstractAstNode).caseNum = 5;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_198,"left parenthesis expected",(allocator *)(local_1b0 + 0x17));
              except(in_RSI,LPAREN,(string *)local_198);
              std::__cxx11::string::~string(local_198);
              std::allocator<char>::~allocator((allocator<char> *)(local_1b0 + 0x17));
              do {
                peVar2 = std::
                         __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)this);
                parse<MyCompiler::Ident>((RecursiveDescentParser *)local_1b0);
                peVar3 = std::
                         __shared_ptr_access<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator*((__shared_ptr_access<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_1b0);
                std::vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_>::push_back
                          (&peVar2->vIdent,peVar3);
                std::shared_ptr<MyCompiler::Ident>::~shared_ptr
                          ((shared_ptr<MyCompiler::Ident> *)local_1b0);
                uVar1 = accept(in_RSI,0xf,__addr_05,in_RCX);
              } while ((uVar1 & 1) != 0);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_1d0,"right parenthesis expected",(allocator *)(local_1e8 + 0x17));
              except(in_RSI,RPAREN,(string *)local_1d0);
              std::__cxx11::string::~string(local_1d0);
              std::allocator<char>::~allocator((allocator<char> *)(local_1e8 + 0x17));
              _Var4._M_pi = extraout_RDX_04;
            }
          }
          else {
            peVar2 = std::
                     __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            (peVar2->super_AbstractAstNode).caseNum = 4;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_138,"left parenthesis expected",(allocator *)(local_150 + 0x17));
            except(in_RSI,LPAREN,(string *)local_138);
            std::__cxx11::string::~string(local_138);
            std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x17));
            do {
              peVar2 = std::
                       __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)this);
              parse<MyCompiler::Ident>((RecursiveDescentParser *)local_150);
              peVar3 = std::
                       __shared_ptr_access<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_150);
              std::vector<MyCompiler::Ident,_std::allocator<MyCompiler::Ident>_>::push_back
                        (&peVar2->vIdent,peVar3);
              std::shared_ptr<MyCompiler::Ident>::~shared_ptr
                        ((shared_ptr<MyCompiler::Ident> *)local_150);
              uVar1 = accept(in_RSI,0xf,__addr_03,in_RCX);
            } while ((uVar1 & 1) != 0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_170,"right parenthesis expected",&local_171);
            except(in_RSI,RPAREN,(string *)local_170);
            std::__cxx11::string::~string(local_170);
            std::allocator<char>::~allocator((allocator<char> *)&local_171);
            _Var4._M_pi = extraout_RDX_03;
          }
        }
        else {
          peVar2 = std::
                   __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          (peVar2->super_AbstractAstNode).caseNum = 3;
          parse<MyCompiler::Ident>((RecursiveDescentParser *)local_118);
          peVar2 = std::
                   __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          std::shared_ptr<MyCompiler::Ident>::operator=
                    (&peVar2->pIdent,(shared_ptr<MyCompiler::Ident> *)local_118);
          std::shared_ptr<MyCompiler::Ident>::~shared_ptr
                    ((shared_ptr<MyCompiler::Ident> *)local_118);
          _Var4._M_pi = extraout_RDX_02;
        }
      }
      else {
        peVar2 = std::
                 __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        (peVar2->super_AbstractAstNode).caseNum = 2;
        parse<MyCompiler::Condition>((RecursiveDescentParser *)local_d0);
        peVar2 = std::
                 __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        std::shared_ptr<MyCompiler::Condition>::operator=
                  (&peVar2->pCondition,(shared_ptr<MyCompiler::Condition> *)local_d0);
        std::shared_ptr<MyCompiler::Condition>::~shared_ptr
                  ((shared_ptr<MyCompiler::Condition> *)local_d0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f0,"do expected",(allocator *)(local_108 + 0x17));
        except(in_RSI,DO,(string *)local_f0);
        std::__cxx11::string::~string(local_f0);
        std::allocator<char>::~allocator((allocator<char> *)(local_108 + 0x17));
        parse<MyCompiler::Statement>((RecursiveDescentParser *)local_108);
        peVar2 = std::
                 __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        std::shared_ptr<MyCompiler::Statement>::operator=
                  (&peVar2->pStatement,(shared_ptr<MyCompiler::Statement> *)local_108);
        std::shared_ptr<MyCompiler::Statement>::~shared_ptr
                  ((shared_ptr<MyCompiler::Statement> *)local_108);
        _Var4._M_pi = extraout_RDX_01;
      }
    }
    else {
      peVar2 = std::
               __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      (peVar2->super_AbstractAstNode).caseNum = 1;
      parse<MyCompiler::Condition>((RecursiveDescentParser *)local_88);
      peVar2 = std::
               __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::shared_ptr<MyCompiler::Condition>::operator=
                (&peVar2->pCondition,(shared_ptr<MyCompiler::Condition> *)local_88);
      std::shared_ptr<MyCompiler::Condition>::~shared_ptr
                ((shared_ptr<MyCompiler::Condition> *)local_88);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"then expected",(allocator *)(local_c0 + 0x17));
      except(in_RSI,THEN,(string *)local_a8);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)(local_c0 + 0x17));
      parse<MyCompiler::Statement>((RecursiveDescentParser *)local_c0);
      peVar2 = std::
               __shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::shared_ptr<MyCompiler::Statement>::operator=
                (&peVar2->pStatement,(shared_ptr<MyCompiler::Statement> *)local_c0);
      std::shared_ptr<MyCompiler::Statement>::~shared_ptr
                ((shared_ptr<MyCompiler::Statement> *)local_c0);
      _Var4._M_pi = extraout_RDX_00;
    }
  }
  sVar5.super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<MyCompiler::Statement>)
         sVar5.super___shared_ptr<MyCompiler::Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MyCompiler::Statement> MyCompiler::RecursiveDescentParser::parse()
{
    auto pResult = std::make_shared<Statement>();

    if (sym == SymbolType::IDENT)
    {
        pResult->caseNum = 0;
        pResult->pIdent = parse<Ident>();
        except(SymbolType::BECOMES, "assignment operator expected");
        pResult->pExpression = parse<Expression>();
    }
    else if (accept(SymbolType::IF))
    {
        pResult->caseNum = 1;
        pResult->pCondition = parse<Condition>();
        except(SymbolType::THEN, "then expected");
        pResult->pStatement = parse<Statement>();
    }
    else if (accept(SymbolType::WHILE))
    {
        pResult->caseNum = 2;
        pResult->pCondition = parse<Condition>();
        except(SymbolType::DO, "do expected");
        pResult->pStatement = parse<Statement>();
    }
    else if (accept(SymbolType::CALL))
    {
        pResult->caseNum = 3;
        pResult->pIdent = parse<Ident>();
    }
    else if (accept(SymbolType::READ))
    {
        pResult->caseNum = 4;
        except(SymbolType::LPAREN, "left parenthesis expected");
        do
            pResult->vIdent.push_back(*parse<Ident>());
        while (accept(SymbolType::COMMA));
        except(SymbolType::RPAREN, "right parenthesis expected");
    }
    else if (accept(SymbolType::WRITE))
    {
        pResult->caseNum = 5;
        except(SymbolType::LPAREN, "left parenthesis expected");
        do
            pResult->vIdent.push_back(*parse<Ident>());
        while (accept(SymbolType::COMMA));
        except(SymbolType::RPAREN, "right parenthesis expected");
    }
    else if (accept(SymbolType::BEGIN))
    {
        pResult->caseNum = 6;
        do
            pResult->vStatement.push_back(*parse<Statement>());
        while (accept(SymbolType::SEMICOLON));
        except(SymbolType::END, "semicolon or end expected");
    }
    else
        pResult->caseNum = 7;

    return pResult;
}